

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int *piVar8;
  uint uVar9;
  uint uVar10;
  void *pvVar11;
  long lVar12;
  void *pvVar13;
  int unaff_EBP;
  bool bVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  float fVar24;
  Mat sums;
  Mat local_78;
  
  sVar4 = a->elemsize;
  iVar2 = a->dims;
  if (iVar2 == 2) {
    uVar10 = a->w;
    uVar17 = (ulong)uVar10;
    uVar9 = a->h;
    uVar18 = (ulong)uVar9;
    if (reduce_w && reduce_h) {
      Mat::create(b,1,1,sVar4,opt->blob_allocator);
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      Mat::create(&local_78,uVar9,sVar4,opt->workspace_allocator);
      unaff_EBP = -100;
      if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
        if (0 < (int)uVar9) {
          pvVar11 = a->data;
          iVar3 = a->w;
          sVar5 = a->elemsize;
          uVar15 = 0;
          do {
            fVar24 = 0.0;
            if (0 < (int)uVar10) {
              uVar20 = 0;
              do {
                fVar1 = *(float *)((long)pvVar11 + uVar20 * 4);
                fVar24 = fVar24 + fVar1 * fVar1;
                uVar20 = uVar20 + 1;
              } while (uVar17 != uVar20);
            }
            *(float *)((long)local_78.data + uVar15 * 4) = fVar24;
            uVar15 = uVar15 + 1;
            pvVar11 = (void *)((long)pvVar11 + (long)iVar3 * sVar5);
          } while (uVar15 != uVar18);
        }
        fVar24 = 0.0;
        if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            fVar24 = fVar24 + *(float *)((long)local_78.data + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
        }
        *(float *)b->data = fVar24;
        unaff_EBP = 0;
      }
      piVar8 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar14 = false;
    }
    else if (reduce_w && !reduce_h) {
      Mat::create(b,1,uVar9,sVar4,opt->blob_allocator);
      if (0 < (int)uVar9) {
        pvVar11 = a->data;
        iVar3 = a->w;
        sVar5 = a->elemsize;
        pvVar13 = b->data;
        uVar15 = 0;
        do {
          fVar24 = 0.0;
          if (0 < (int)uVar10) {
            uVar20 = 0;
            do {
              fVar1 = *(float *)((long)pvVar11 + uVar20 * 4);
              fVar24 = fVar24 + fVar1 * fVar1;
              uVar20 = uVar20 + 1;
            } while (uVar17 != uVar20);
          }
          *(float *)((long)pvVar13 + uVar15 * 4) = fVar24;
          uVar15 = uVar15 + 1;
          pvVar11 = (void *)((long)pvVar11 + (long)iVar3 * sVar5);
        } while (uVar15 != uVar18);
        goto LAB_0020cd2b;
      }
      bVar14 = false;
      unaff_EBP = 0;
    }
    else if (reduce_h && !reduce_w) {
      Mat::create(b,uVar10,1,sVar4,opt->blob_allocator);
      uVar16 = b->c * (int)b->cstep;
      if (0 < (int)uVar16) {
        memset(b->data,0,(ulong)uVar16 << 2);
      }
      if (0 < (int)uVar9) {
        pvVar11 = a->data;
        iVar3 = a->w;
        sVar5 = a->elemsize;
        pvVar13 = b->data;
        uVar15 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar20 = 0;
            do {
              fVar24 = *(float *)((long)pvVar11 + uVar20 * 4);
              *(float *)((long)pvVar13 + uVar20 * 4) =
                   fVar24 * fVar24 + *(float *)((long)pvVar13 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar17 != uVar20);
          }
          uVar15 = uVar15 + 1;
          pvVar11 = (void *)((long)pvVar11 + (long)iVar3 * sVar5);
        } while (uVar15 != uVar18);
      }
LAB_0020cd2b:
      bVar14 = false;
      unaff_EBP = 0;
    }
    else {
      bVar14 = true;
    }
    if (!bVar14) {
      return unaff_EBP;
    }
  }
  else if (iVar2 == 1) {
    iVar2 = a->w;
    Mat::create(b,1,sVar4,opt->blob_allocator);
    if ((long)iVar2 < 1) {
      fVar24 = 0.0;
    }
    else {
      fVar24 = 0.0;
      lVar12 = 0;
      do {
        fVar1 = *(float *)((long)a->data + lVar12 * 4);
        fVar24 = fVar24 + fVar1 * fVar1;
        lVar12 = lVar12 + 1;
      } while (iVar2 != lVar12);
    }
    *(float *)b->data = fVar24;
    return 0;
  }
  if (iVar2 != 3) {
    return 0;
  }
  uVar10 = a->w;
  uVar17 = (ulong)uVar10;
  uVar9 = a->h;
  uVar18 = (ulong)uVar9;
  uVar16 = a->c;
  uVar15 = (ulong)uVar16;
  uVar22 = uVar9 * uVar10;
  bVar14 = !reduce_w;
  if ((!bVar14 && reduce_h) && reduce_c) {
    Mat::create(b,1,1,1,sVar4,opt->blob_allocator);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,uVar16,sVar4,opt->workspace_allocator);
    unaff_EBP = -100;
    if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
      if (0 < (int)uVar16) {
        pvVar11 = a->data;
        sVar4 = a->cstep;
        sVar5 = a->elemsize;
        uVar18 = 0;
        do {
          fVar24 = 0.0;
          if (0 < (int)uVar22) {
            uVar17 = 0;
            do {
              fVar1 = *(float *)((long)pvVar11 + uVar17 * 4);
              fVar24 = fVar24 + fVar1 * fVar1;
              uVar17 = uVar17 + 1;
            } while (uVar22 != uVar17);
          }
          *(float *)((long)local_78.data + uVar18 * 4) = fVar24;
          uVar18 = uVar18 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar5);
        } while (uVar18 != uVar15);
      }
      fVar24 = 0.0;
      if (0 < (int)uVar16) {
        uVar18 = 0;
        do {
          fVar24 = fVar24 + *(float *)((long)local_78.data + uVar18 * 4);
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
      }
      *(float *)b->data = fVar24;
      unaff_EBP = 0;
    }
    piVar8 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
LAB_0020d46b:
    bVar14 = false;
  }
  else {
    if ((!bVar14 && reduce_h) && !reduce_c) {
      Mat::create(b,1,1,uVar16,sVar4,opt->blob_allocator);
      if (0 < (int)uVar16) {
        pvVar11 = a->data;
        sVar4 = a->cstep;
        pvVar13 = b->data;
        sVar5 = b->cstep;
        sVar6 = a->elemsize;
        sVar7 = b->elemsize;
        uVar18 = 0;
        do {
          fVar24 = 0.0;
          if (0 < (int)uVar22) {
            uVar17 = 0;
            do {
              fVar1 = *(float *)((long)pvVar11 + uVar17 * 4);
              fVar24 = fVar24 + fVar1 * fVar1;
              uVar17 = uVar17 + 1;
            } while (uVar22 != uVar17);
          }
          *(float *)((long)pvVar13 + sVar5 * sVar7 * uVar18) = fVar24;
          uVar18 = uVar18 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar6);
        } while (uVar18 != uVar15);
      }
    }
    else {
      lVar12 = (long)(int)uVar10;
      if ((bVar14 || reduce_h) || reduce_c) {
        if ((!bVar14 && !reduce_h) && reduce_c) {
          Mat::create(b,1,uVar9,1,sVar4,opt->blob_allocator);
          local_78.cstep = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.d = 0;
          local_78.c = 0;
          Mat::create(&local_78,1,uVar9,uVar16,sVar4,opt->workspace_allocator);
          unaff_EBP = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < (int)uVar16) {
              pvVar11 = a->data;
              sVar4 = a->cstep;
              sVar5 = a->elemsize;
              uVar20 = 0;
              do {
                if (0 < (int)uVar9) {
                  uVar21 = 0;
                  pvVar13 = pvVar11;
                  do {
                    fVar24 = 0.0;
                    if (0 < (int)uVar10) {
                      uVar23 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar13 + uVar23 * 4);
                        fVar24 = fVar24 + fVar1 * fVar1;
                        uVar23 = uVar23 + 1;
                      } while (uVar17 != uVar23);
                    }
                    *(float *)((long)local_78.data +
                              uVar21 * 4 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                              uVar20) = fVar24;
                    uVar21 = uVar21 + 1;
                    pvVar13 = (void *)((long)pvVar13 + lVar12 * 4);
                  } while (uVar21 != uVar18);
                }
                uVar20 = uVar20 + 1;
                pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar5);
              } while (uVar20 != uVar15);
            }
            uVar10 = b->c * (int)b->cstep;
            if (0 < (int)uVar10) {
              memset(b->data,0,(ulong)uVar10 << 2);
            }
            if (0 < (int)uVar16) {
              pvVar11 = b->data;
              uVar17 = 0;
              pvVar13 = local_78.data;
              do {
                if (0 < (int)uVar9) {
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar11 + uVar20 * 4) =
                         *(float *)((long)pvVar13 + uVar20 * 4) +
                         *(float *)((long)pvVar11 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar18 != uVar20);
                }
                uVar17 = uVar17 + 1;
                pvVar13 = (void *)((long)pvVar13 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (uVar17 != uVar15);
            }
LAB_0020d45f:
            unaff_EBP = 0;
          }
        }
        else {
          if ((!reduce_h || reduce_w) || !reduce_c) {
            if ((!reduce_w && !reduce_h) && reduce_c) {
              Mat::create(b,uVar10,uVar9,1,sVar4,opt->blob_allocator);
              uVar10 = b->c * (int)b->cstep;
              if (0 < (int)uVar10) {
                memset(b->data,0,(ulong)uVar10 << 2);
              }
              if (0 < (int)uVar16) {
                pvVar11 = a->data;
                sVar4 = a->cstep;
                pvVar13 = b->data;
                sVar5 = a->elemsize;
                uVar18 = 0;
                unaff_EBP = 0;
                do {
                  if (0 < (int)uVar22) {
                    uVar17 = 0;
                    do {
                      fVar24 = *(float *)((long)pvVar11 + uVar17 * 4);
                      *(float *)((long)pvVar13 + uVar17 * 4) =
                           fVar24 * fVar24 + *(float *)((long)pvVar13 + uVar17 * 4);
                      uVar17 = uVar17 + 1;
                    } while (uVar22 != uVar17);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar5);
                  bVar14 = false;
                } while (uVar18 != uVar15);
                goto LAB_0020d46d;
              }
            }
            else {
              bVar14 = true;
              if ((!reduce_h || reduce_w) || reduce_c) goto LAB_0020d46d;
              Mat::create(b,uVar10,1,uVar16,sVar4,opt->blob_allocator);
              uVar22 = b->c * (int)b->cstep;
              if (0 < (int)uVar22) {
                memset(b->data,0,(ulong)uVar22 << 2);
              }
              if (0 < (int)uVar16) {
                pvVar11 = a->data;
                sVar4 = a->cstep;
                pvVar13 = b->data;
                sVar5 = b->cstep;
                sVar6 = b->elemsize;
                sVar7 = a->elemsize;
                uVar18 = 0;
                unaff_EBP = 0;
                do {
                  if (0 < (int)uVar9) {
                    uVar16 = 0;
                    pvVar19 = pvVar11;
                    do {
                      if (0 < (int)uVar10) {
                        uVar20 = 0;
                        do {
                          fVar24 = *(float *)((long)pvVar19 + uVar20 * 4);
                          *(float *)((long)pvVar13 + uVar20 * 4) =
                               fVar24 * fVar24 + *(float *)((long)pvVar13 + uVar20 * 4);
                          uVar20 = uVar20 + 1;
                        } while (uVar17 != uVar20);
                      }
                      uVar16 = uVar16 + 1;
                      pvVar19 = (void *)((long)pvVar19 + lVar12 * 4);
                    } while (uVar16 != uVar9);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar7);
                  pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar6);
                  bVar14 = false;
                } while (uVar18 != uVar15);
                goto LAB_0020d46d;
              }
            }
            goto LAB_0020d131;
          }
          Mat::create(b,uVar10,1,1,sVar4,opt->blob_allocator);
          local_78.cstep = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.d = 0;
          local_78.c = 0;
          Mat::create(&local_78,uVar10,1,uVar16,sVar4,opt->workspace_allocator);
          unaff_EBP = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < (int)uVar16) {
              pvVar11 = a->data;
              sVar4 = a->cstep;
              sVar5 = a->elemsize;
              uVar18 = 0;
              pvVar13 = local_78.data;
              do {
                if (0 < (int)uVar9) {
                  uVar22 = 0;
                  pvVar19 = pvVar11;
                  do {
                    if (0 < (int)uVar10) {
                      uVar20 = 0;
                      do {
                        fVar24 = *(float *)((long)pvVar19 + uVar20 * 4);
                        *(float *)((long)pvVar13 + uVar20 * 4) =
                             fVar24 * fVar24 + *(float *)((long)pvVar13 + uVar20 * 4);
                        uVar20 = uVar20 + 1;
                      } while (uVar17 != uVar20);
                    }
                    uVar22 = uVar22 + 1;
                    pvVar19 = (void *)((long)pvVar19 + lVar12 * 4);
                  } while (uVar22 != uVar9);
                }
                uVar18 = uVar18 + 1;
                pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar5);
                pvVar13 = (void *)((long)pvVar13 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (uVar18 != uVar15);
            }
            uVar9 = b->c * (int)b->cstep;
            if (0 < (int)uVar9) {
              memset(b->data,0,(ulong)uVar9 << 2);
            }
            if (0 < (int)uVar16) {
              pvVar11 = b->data;
              uVar18 = 0;
              pvVar13 = local_78.data;
              do {
                if (0 < (int)uVar10) {
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar11 + uVar20 * 4) =
                         *(float *)((long)pvVar13 + uVar20 * 4) +
                         *(float *)((long)pvVar11 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar17 != uVar20);
                }
                uVar18 = uVar18 + 1;
                pvVar13 = (void *)((long)pvVar13 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (uVar18 != uVar15);
            }
            goto LAB_0020d45f;
          }
        }
        Mat::~Mat(&local_78);
        goto LAB_0020d46b;
      }
      Mat::create(b,1,uVar9,uVar16,sVar4,opt->blob_allocator);
      if (0 < (int)uVar16) {
        pvVar11 = a->data;
        sVar4 = a->cstep;
        sVar5 = b->cstep;
        sVar6 = b->elemsize;
        sVar7 = a->elemsize;
        pvVar13 = b->data;
        uVar20 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar21 = 0;
            pvVar19 = pvVar11;
            do {
              fVar24 = 0.0;
              if (0 < (int)uVar10) {
                uVar23 = 0;
                do {
                  fVar1 = *(float *)((long)pvVar19 + uVar23 * 4);
                  fVar24 = fVar24 + fVar1 * fVar1;
                  uVar23 = uVar23 + 1;
                } while (uVar17 != uVar23);
              }
              *(float *)((long)pvVar13 + uVar21 * 4 + sVar5 * sVar6 * uVar20) = fVar24;
              uVar21 = uVar21 + 1;
              pvVar19 = (void *)((long)pvVar19 + lVar12 * 4);
            } while (uVar21 != uVar18);
          }
          uVar20 = uVar20 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar7);
        } while (uVar20 != uVar15);
      }
    }
LAB_0020d131:
    bVar14 = false;
    unaff_EBP = 0;
  }
LAB_0020d46d:
  if (bVar14) {
    return 0;
  }
  return unaff_EBP;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}